

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space_mixer.c
# Opt level: O0

int space_mixer_free(mixed_segment *segment)

{
  long *plVar1;
  space_mixer_data *data;
  mixed_segment *segment_local;
  
  plVar1 = (long *)segment->data;
  if (plVar1 != (long *)0x0) {
    free_fft_window_data((fft_window_data *)(plVar1 + 0xa8a));
    if (plVar1[2] != 0) {
      (*mixed_free)((void *)plVar1[2]);
      plVar1[2] = 0;
    }
    if (*plVar1 != 0) {
      (*mixed_free)((void *)*plVar1);
      *plVar1 = 0;
    }
    (*mixed_free)(plVar1);
  }
  segment->data = (void *)0x0;
  return 1;
}

Assistant:

int space_mixer_free(struct mixed_segment *segment){
  struct space_mixer_data *data = (struct space_mixer_data *)segment->data;
  if(data){
    free_fft_window_data(&data->fft_window_data);
    FREE(data->out);
    FREE(data->sources);
    mixed_free(data);
  }
  segment->data = 0;
  return 1;
}